

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::Test::Run(Test *this)

{
  bool bVar1;
  OsStackTraceGetterInterface *pOVar2;
  UnitTestImpl *impl;
  char *in_stack_00000048;
  offset_in_Test_to_subr in_stack_00000050;
  Test *in_stack_00000060;
  UnitTestImpl *in_stack_ffffffffffffffc0;
  
  bVar1 = HasSameFixtureClass();
  if (bVar1) {
    internal::GetUnitTestImpl();
    pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
    (*pOVar2->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
              (in_stack_00000060,in_stack_00000050,in_stack_00000048);
    bVar1 = HasFatalFailure();
    if ((!bVar1) && (bVar1 = IsSkipped(), !bVar1)) {
      pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
      (*pOVar2->_vptr_OsStackTraceGetterInterface[3])();
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
                (in_stack_00000060,in_stack_00000050,in_stack_00000048);
    }
    pOVar2 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
    (*pOVar2->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
              (in_stack_00000060,in_stack_00000050,in_stack_00000048);
  }
  return;
}

Assistant:

void Test::Run() {
  if (!HasSameFixtureClass()) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(this, &Test::SetUp, "SetUp()");
  // We will run the test only if SetUp() was successful and didn't call
  // GTEST_SKIP().
  if (!HasFatalFailure() && !IsSkipped()) {
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(this, &Test::TestBody,
                                                  "the test body");
  }

  // However, we want to clean up as much as possible.  Hence we will
  // always call TearDown(), even if SetUp() or the test body has
  // failed.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(this, &Test::TearDown,
                                                "TearDown()");
}